

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

void __thiscall Not::Not(Not *this,shared_ptr<Token> *t,shared_ptr<Expr> *x2)

{
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&t->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
  Logical::Logical(&this->super_Logical,(shared_ptr<Token> *)&local_38,(shared_ptr<Expr> *)&local_48
                   ,(shared_ptr<Expr> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  (this->super_Logical).super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR_toJson_abi_cxx11__0012b1e0;
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &(((x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type).
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_88,
             &(((x2->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type).
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_Logical).super_Expr.super_Node._vptr_Node[7])(&local_68,this,&local_78,&_Stack_88);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_Logical).super_Expr.type.
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  return;
}

Assistant:

Not(std::shared_ptr<Token> t,  std::shared_ptr<Expr> x2) : Logical(t, x2, x2) {
		type = check(x2->type, x2->type);
	}